

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintAttribute(TidyDocImpl *doc,uint indent,Node *node,AttVal *attr)

{
  long lVar1;
  Bool BVar2;
  uint uVar3;
  Bool scriptAttr_00;
  char *local_80;
  Bool scriptAttr;
  Bool isB;
  tchar c;
  Bool wrappable;
  tmbstr name;
  uint local_48;
  Bool first;
  uint xtra;
  Bool indAttrs;
  uint ucAttrs;
  Bool wrapAttrs;
  Bool xhtmlOut;
  Bool xmlOut;
  TidyPrintImpl *pprint;
  AttVal *attr_local;
  Node *node_local;
  TidyDocImpl *pTStack_10;
  uint indent_local;
  TidyDocImpl *doc_local;
  
  _xhtmlOut = &doc->pprint;
  wrapAttrs = (Bool)(doc->config).value[100].v;
  ucAttrs = (uint)(doc->config).value[0x62].v;
  indAttrs = (Bool)(doc->config).value[0x5b].v;
  xtra = (uint)(doc->config).value[0x54].v;
  first = (Bool)(doc->config).value[0x23].v;
  pprint = (TidyPrintImpl *)attr;
  attr_local = (AttVal *)node;
  node_local._4_4_ = indent;
  pTStack_10 = doc;
  local_48 = AttrIndent(doc,node,attr);
  name._4_4_ = (uint)(pprint == (TidyPrintImpl *)attr_local->attribute);
  _c = *(byte **)&pprint->indent[0].attrValStart;
  isB = no;
  if (first == no) {
    local_48 = 0;
  }
  else {
    BVar2 = prvTidynodeIsElement((Node *)attr_local);
    if ((BVar2 != no) && (name._4_4_ == 0)) {
      node_local._4_4_ = local_48 + node_local._4_4_;
      PCondFlushLineSmart(pTStack_10,node_local._4_4_);
    }
  }
  CheckWrapIndent(pTStack_10,node_local._4_4_);
  if (((wrapAttrs == no) && (ucAttrs == 0)) && (pprint->linebuf != (uint *)0x0)) {
    BVar2 = prvTidyIsScript(pTStack_10,(ctmbstr)_c);
    if (BVar2 == no) {
      if (((((pprint == (TidyPrintImpl *)0x0) || (pprint->linebuf == (uint *)0x0)) ||
           (*pprint->linebuf != 0x24)) &&
          (((pprint == (TidyPrintImpl *)0x0 || (pprint->linebuf == (uint *)0x0)) ||
           (*pprint->linebuf != 0x9c)))) &&
         (((((pprint == (TidyPrintImpl *)0x0 || (pprint->linebuf == (uint *)0x0)) ||
            (*pprint->linebuf != 10)) &&
           (((pprint == (TidyPrintImpl *)0x0 || (pprint->linebuf == (uint *)0x0)) ||
            (*pprint->linebuf != 0x96)))) && (indAttrs != no)))) {
        isB = yes;
      }
    }
    else {
      isB = (Bool)(pTStack_10->config).value[0x5f].v;
    }
  }
  if ((name._4_4_ == 0) && (BVar2 = SetWrap(pTStack_10,node_local._4_4_), BVar2 == no)) {
    prvTidyPFlushLine(pTStack_10,node_local._4_4_ + local_48);
  }
  else if (_xhtmlOut->linelen != 0) {
    AddChar(_xhtmlOut,0x20);
  }
  for (; *_c != 0; _c = _c + 1) {
    scriptAttr = (Bool)*_c;
    if (scriptAttr < 0x80) {
      if (xtra == 1) {
        scriptAttr = prvTidyToUpper(scriptAttr);
      }
    }
    else {
      uVar3 = prvTidyGetUTF8((ctmbstr)_c,&scriptAttr);
      _c = _c + uVar3;
    }
    AddChar(_xhtmlOut,scriptAttr);
  }
  CheckWrapIndent(pTStack_10,node_local._4_4_);
  lVar1._0_4_ = pprint->indent[1].spaces;
  lVar1._4_4_ = pprint->indent[1].attrValStart;
  if (lVar1 == 0) {
    BVar2 = prvTidyIsBoolAttribute((AttVal *)pprint);
    scriptAttr_00 = prvTidyattrIsEvent((AttVal *)pprint);
    if (wrapAttrs == no) {
      if ((BVar2 == no) && (BVar2 = prvTidyIsNewNode((Node *)attr_local), BVar2 == no)) {
        PPrintAttrValue(pTStack_10,node_local._4_4_,"",pprint->ixInd,yes,scriptAttr_00);
      }
      else {
        SetWrap(pTStack_10,node_local._4_4_);
      }
    }
    else {
      if (BVar2 == no) {
        local_80 = "";
      }
      else {
        local_80 = *(char **)&pprint->indent[0].attrValStart;
      }
      PPrintAttrValue(pTStack_10,node_local._4_4_,local_80,pprint->ixInd,no,scriptAttr_00);
    }
  }
  else {
    PPrintAttrValue(pTStack_10,node_local._4_4_,*(ctmbstr *)(pprint->indent + 1),pprint->ixInd,isB,
                    no);
  }
  return;
}

Assistant:

static void PPrintAttribute( TidyDocImpl* doc, uint indent,
                             Node *node, AttVal *attr )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool xmlOut    = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut  = cfgBool( doc, TidyXhtmlOut );
    Bool wrapAttrs = cfgBool( doc, TidyWrapAttVals );
    uint ucAttrs   = cfg( doc, TidyUpperCaseAttrs );
    Bool indAttrs  = cfgBool( doc, TidyIndentAttributes );
    uint xtra      = AttrIndent( doc, node, attr );
    Bool first     = (attr == node->attributes);
    tmbstr name    = attr->attribute;
    Bool wrappable = no;
    tchar c;

    /* fix for odd attribute indentation bug triggered by long values */
    if (!indAttrs)
      xtra = 0;

    if ( indAttrs )
    {
        if ( TY_(nodeIsElement)(node) && !first )
        {
            indent += xtra;
            PCondFlushLineSmart( doc, indent );
        }
    }

    CheckWrapIndent( doc, indent );

    if ( !xmlOut && !xhtmlOut && attr->dict )
    {
        if ( TY_(IsScript)(doc, name) )
            wrappable = cfgBool( doc, TidyWrapScriptlets );
        else if (!(attrIsCONTENT(attr) || attrIsVALUE(attr) || attrIsALT(attr) || attrIsTITLE(attr)) && wrapAttrs )
            wrappable = yes;
    }

    if ( !first && !SetWrap(doc, indent) )
    {
        TY_(PFlushLine)( doc, indent+xtra );  /* Put it on next line */
    }
    else if ( pprint->linelen > 0 )
    {
        AddChar( pprint, ' ' );
    }

    /* Attribute name */
    while (*name)
    {
        c = (unsigned char)*name;

        if (c > 0x7F)
            name += TY_(GetUTF8)(name, &c);
        else if (ucAttrs == TidyUppercaseYes)
            c = TY_(ToUpper)(c);

        AddChar(pprint, c);
        ++name;
    }

    CheckWrapIndent( doc, indent );
 
    if ( attr->value == NULL )
    {
        Bool isB = TY_(IsBoolAttribute)(attr);
        Bool scriptAttr = TY_(attrIsEvent)(attr);

        if ( xmlOut )
            PPrintAttrValue( doc, indent, isB ? attr->attribute : NULLSTR,
                             attr->delim, no, scriptAttr );

        else if ( !isB && !TY_(IsNewNode)(node) )
            PPrintAttrValue( doc, indent, "", attr->delim, yes, scriptAttr );

        else 
            SetWrap( doc, indent );
    }
    else
        PPrintAttrValue( doc, indent, attr->value, attr->delim, wrappable, no );
}